

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O0

ssize_t __thiscall
xercesc_4_0::DOMLSSerializerImpl::write(DOMLSSerializerImpl *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  XMLCh *pXVar3;
  LocalFileFormatTarget *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  XMLFormatter *this_01;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  DOMNode *nodeToWrite;
  size_t size;
  XMLCh *local_110;
  XMLCh *local_f0;
  DOMNode *local_c8;
  DOMNode *local_c0;
  TranscodingException *anon_var_0;
  Codes anon_var_0_1;
  OutOfMemoryException *anon_var_0_2;
  Janitor<xercesc_4_0::XMLFormatter> janName;
  TranscodingException *e;
  XMLCh *tmpEncoding;
  XMLCh *lsEncoding;
  DOMDocument *docu;
  XMLCh *szSystemId;
  Janitor<xercesc_4_0::XMLFormatTarget> janTarget;
  XMLFormatTarget *pTarget;
  DOMLSOutput *destination_local;
  DOMNode *nodeToWrite_local;
  DOMLSSerializerImpl *this_local;
  
  nodeToWrite = (DOMNode *)CONCAT44(in_register_00000034,__fd);
  janTarget.fData = (XMLFormatTarget *)(**(code **)(*__buf + 0x10))();
  size = 0;
  Janitor<xercesc_4_0::XMLFormatTarget>::Janitor
            ((Janitor<xercesc_4_0::XMLFormatTarget> *)&szSystemId,(XMLFormatTarget *)0x0);
  if (janTarget.fData == (XMLFormatTarget *)0x0) {
    pXVar3 = (XMLCh *)(**(code **)(*__buf + 0x20))();
    if (pXVar3 == (XMLCh *)0x0) {
      this_local._7_1_ = false;
      goto LAB_00319626;
    }
    this_00 = (LocalFileFormatTarget *)XMemory::operator_new((XMemory *)0x30,size);
    LocalFileFormatTarget::LocalFileFormatTarget(this_00,pXVar3,this->fMemoryManager);
    janTarget.fData = (XMLFormatTarget *)this_00;
    Janitor<xercesc_4_0::XMLFormatTarget>::reset
              ((Janitor<xercesc_4_0::XMLFormatTarget> *)&szSystemId,(XMLFormatTarget *)this_00);
  }
  this->fEncodingUsed = (XMLCh *)gUTF8;
  iVar2 = (*nodeToWrite->_vptr_DOMNode[4])();
  if (iVar2 == 9) {
    if (nodeToWrite == (DOMNode *)0x0) {
      local_c0 = (DOMNode *)0x0;
    }
    else {
      local_c0 = nodeToWrite + -3;
    }
    local_c8 = local_c0;
  }
  else {
    iVar2 = (*nodeToWrite->_vptr_DOMNode[0xc])();
    local_c8 = (DOMNode *)CONCAT44(extraout_var,iVar2);
  }
  pXVar3 = (XMLCh *)(**(code **)(*__buf + 0x18))();
  if ((pXVar3 == (XMLCh *)0x0) || (*pXVar3 == L'\0')) {
    if (local_c8 != (DOMNode *)0x0) {
      iVar2 = (*local_c8->_vptr_DOMNode[0x14])();
      pXVar3 = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
      if ((pXVar3 == (XMLCh *)0x0) || (*pXVar3 == L'\0')) {
        iVar2 = (*local_c8->_vptr_DOMNode[0x15])();
        pXVar3 = (XMLCh *)CONCAT44(extraout_var_01,iVar2);
        if ((pXVar3 != (XMLCh *)0x0) && (*pXVar3 != L'\0')) {
          this->fEncodingUsed = pXVar3;
        }
      }
      else {
        this->fEncodingUsed = pXVar3;
      }
    }
  }
  else {
    this->fEncodingUsed = pXVar3;
  }
  if ((this->fNewLine == (XMLCh *)0x0) || (*this->fNewLine == L'\0')) {
    local_f0 = L"\n";
  }
  else {
    local_f0 = this->fNewLine;
  }
  this->fNewLineUsed = local_f0;
  if (((local_c8 == (DOMNode *)0x0) ||
      (iVar2 = (*local_c8->_vptr_DOMNode[0x18])(), CONCAT44(extraout_var_02,iVar2) == 0)) ||
     (iVar2 = (*local_c8->_vptr_DOMNode[0x18])(), *(short *)CONCAT44(extraout_var_03,iVar2) == 0)) {
    local_110 = L"1.0";
  }
  else {
    iVar2 = (*local_c8->_vptr_DOMNode[0x18])();
    local_110 = (XMLCh *)CONCAT44(extraout_var_04,iVar2);
  }
  this->fDocumentVersion = local_110;
  bVar1 = XMLString::equals(this->fDocumentVersion,L"1.1");
  this->fIsXml11 = bVar1;
  this->fErrorCount = 0;
  this->fLineFeedInTextNodePrinted = false;
  this->fLastWhiteSpaceInTextNode = 0;
  this_01 = (XMLFormatter *)XMemory::operator_new(0x4090,this->fMemoryManager);
  XMLFormatter::XMLFormatter
            (this_01,this->fEncodingUsed,this->fDocumentVersion,janTarget.fData,NoEscapes,
             UnRep_CharRef,this->fMemoryManager);
  this->fFormatter = this_01;
  Janitor<xercesc_4_0::XMLFormatter>::Janitor
            ((Janitor<xercesc_4_0::XMLFormatter> *)&anon_var_0_2,this->fFormatter);
  processNode(this,nodeToWrite);
  (*(janTarget.fData)->_vptr_XMLFormatTarget[3])();
  Janitor<xercesc_4_0::XMLFormatter>::~Janitor((Janitor<xercesc_4_0::XMLFormatter> *)&anon_var_0_2);
  this_local._7_1_ = this->fErrorCount == 0;
LAB_00319626:
  Janitor<xercesc_4_0::XMLFormatTarget>::~Janitor
            ((Janitor<xercesc_4_0::XMLFormatTarget> *)&szSystemId);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_);
}

Assistant:

bool DOMLSSerializerImpl::write(const DOMNode* nodeToWrite,
                                DOMLSOutput* const destination)
{
    XMLFormatTarget* pTarget=destination->getByteStream();
    Janitor<XMLFormatTarget> janTarget(0);
    if(!pTarget)
    {
        const XMLCh* szSystemId=destination->getSystemId();
        if(!szSystemId)
        {
            //TODO: report error "missing target"
            return false;
        }
        pTarget=new LocalFileFormatTarget(szSystemId, fMemoryManager);
        janTarget.reset(pTarget);
    }
    /**
     * When writing to a LSOutput, the encoding is found by looking at the encoding information
     * that is reachable through the LSOutput and the item to be written (or its owner document) in this order:
     *
     *  1. LSOutput.encoding,
     *  2. Document.inputEncoding,
     *  3. Document.xmlEncoding.
     *
     * If no encoding is reachable through the above properties, a default encoding of "UTF-8" will be used.
     * If the specified encoding is not supported an "unsupported-encoding" fatal error is raised.
     */
    fEncodingUsed = gUTF8;

    const DOMDocument *docu = (nodeToWrite->getNodeType() == DOMNode::DOCUMENT_NODE)?
                              (const DOMDocument*)nodeToWrite : nodeToWrite->getOwnerDocument();

    const XMLCh* lsEncoding=destination->getEncoding();
    if (lsEncoding && *lsEncoding)
    {
        fEncodingUsed = lsEncoding;
    }
    else if (docu)
    {
        const XMLCh* tmpEncoding = docu->getInputEncoding();

        if ( tmpEncoding && *tmpEncoding)
        {
            fEncodingUsed = tmpEncoding;
        }
        else
        {
            tmpEncoding = docu->getXmlEncoding();

            if ( tmpEncoding && *tmpEncoding)
            {
                fEncodingUsed = tmpEncoding;
            }
        }
    }


    /**
     *  The end-of-line sequence of characters to be used in the XML being
     *  written out. The only permitted values are these:
     *     . null
     *
     *  Use a default end-of-line sequence. DOM implementations should choose
     * the default to match the usual convention for text files in the
     * environment being used. Implementations must choose a default
     * sequence that matches one of those allowed by  2.11 "End-of-Line
     * Handling".
     *
     *    CR    The carriage-return character (#xD)
     *    CR-LF The carriage-return and line-feed characters (#xD #xA)
     *    LF    The line-feed character (#xA)
     *
     *  The default value for this attribute is null
     */
    fNewLineUsed = (fNewLine && *fNewLine)? fNewLine : gEOLSeq;

    /**
     *  get Document Version
     */
    fDocumentVersion = (docu && docu->getXmlVersion() && *(docu->getXmlVersion()))?docu->getXmlVersion():XMLUni::fgVersion1_0;
    fIsXml11 = XMLString::equals(fDocumentVersion, XMLUni::fgVersion1_1);

    fErrorCount = 0;

    fLineFeedInTextNodePrinted = false;
    fLastWhiteSpaceInTextNode = 0;

    try
    {
        fFormatter = new (fMemoryManager) XMLFormatter( fEncodingUsed
                                                       ,fDocumentVersion
                                                       ,pTarget
                                                       ,XMLFormatter::NoEscapes
                                                       ,XMLFormatter::UnRep_CharRef
                                                       ,fMemoryManager);
    }
    catch (const TranscodingException& e)
    {
        reportError(nodeToWrite, DOMError::DOM_SEVERITY_FATAL_ERROR, e.getMessage());
        return false;
    }

    try
    {
        Janitor<XMLFormatter> janName(fFormatter);
        processNode(nodeToWrite);
        pTarget->flush();
    }

    //
    // The serialize engine (processNode) throws an exception to abort
    // serialization if
    //
    //   . A fatal error occurs which renders the output ill-formed, or
    //   . Instructed by the application's error handler
    //
    catch (const TranscodingException&)
    {
        pTarget->flush();
        return false;
    }

    catch (const XMLDOMMsg::Codes)
    {
        pTarget->flush();
        return false;
    }
    catch(const OutOfMemoryException&)
    {
        throw;
    }
    catch (...)
    {
        pTarget->flush();
        throw;
    }

    //
    // true if node was successfully serialized and
    // false in case a failure occured and the
    // failure wasn't canceled by the error handler.
    //
    return ((fErrorCount == 0)? true : false);
}